

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

Token * __thiscall Parser::peekToken(Parser *this,int delta)

{
  pointer pTVar1;
  undefined8 extraout_RAX;
  ulong uVar2;
  Parser *this_00;
  allocator local_29;
  
  uVar2 = (long)delta + (long)this->mTokenIndex;
  pTVar1 = (this->mTokens).super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (uVar2 < (ulong)(((long)(this->mTokens).super__Vector_base<Token,_std::allocator<Token>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)pTVar1) / 0x50)) {
    return pTVar1 + uVar2;
  }
  this_00 = (Parser *)&stack0xffffffffffffffd8;
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffd8,"Reached end of tokens.",&local_29);
  parseError(this_00,(string *)&stack0xffffffffffffffd8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd8);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

Token& Parser::peekToken(int delta) {
	int nextTokenIndex = mTokenIndex + delta;

	if ((std::size_t)nextTokenIndex >= mTokens.size()) {
		parseError("Reached end of tokens.");
	}

	return mTokens[nextTokenIndex];
}